

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCovering::IfcCovering(IfcCovering *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcCovering";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__0077a798);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x77a668;
  *(undefined8 *)&this->field_0x180 = 0x77a780;
  *(undefined8 *)&this->field_0x88 = 0x77a690;
  *(undefined8 *)&this->field_0x98 = 0x77a6b8;
  *(undefined8 *)&this->field_0xd0 = 0x77a6e0;
  *(undefined8 *)&this->field_0x100 = 0x77a708;
  *(undefined8 *)&this->field_0x138 = 0x77a730;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x77a758;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x18 =
       0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x20 = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcCovering() : Object("IfcCovering") {}